

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O2

void __thiscall
Diligent::ShaderResourceHashKey::ShaderResourceHashKey<char_const*const&>
          (ShaderResourceHashKey *this,SHADER_TYPE _ShaderStages,char **Args)

{
  size_t sVar1;
  SHADER_TYPE local_1c;
  ulong local_18;
  
  HashMapStringKey::HashMapStringKey(&this->super_HashMapStringKey,*Args,false);
  this->ShaderStages = _ShaderStages;
  local_18 = (this->super_HashMapStringKey).Ownership_Hash & 0x7fffffffffffffff;
  local_1c = _ShaderStages;
  sVar1 = ComputeHash<unsigned_long,unsigned_int>(&local_18,&local_1c);
  (this->super_HashMapStringKey).Ownership_Hash = sVar1 & 0x7fffffffffffffff;
  return;
}

Assistant:

ShaderResourceHashKey(const SHADER_TYPE _ShaderStages,
                          ArgsType&&... Args) noexcept :
        // clang-format off
        HashMapStringKey{std::forward<ArgsType>(Args)...},
        ShaderStages    {_ShaderStages}
    // clang-format on
    {
        Ownership_Hash = ComputeHash(GetHash(), Uint32{ShaderStages}) & HashMask;
    }